

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O3

void __thiscall
IOContextDemuxer::IOContextDemuxer(IOContextDemuxer *this,BufferedReaderManager *readManager)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  AbstractReader *pAVar3;
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__IOContextDemuxer_0023daa0;
  memset(this->tracks,0,0x200);
  this->m_readManager = readManager;
  this->m_lastReadRez = 0;
  this->m_lastProcessedBytes = 0;
  pAVar3 = BufferedReaderManager::getReader(readManager,"");
  this->m_bufferedReader = pAVar3;
  iVar2 = (*pAVar3->_vptr_AbstractReader[6])(pAVar3,0xbc);
  this->m_readerID = iVar2;
  this->m_processedBytes = 0;
  this->num_tracks = 0;
  this->m_curPos = (uint8_t *)0x0;
  this->m_bufEnd = (uint8_t *)0x0;
  this->m_isEOF = false;
  return;
}

Assistant:

IOContextDemuxer::IOContextDemuxer(const BufferedReaderManager& readManager)
    : tracks(), m_readManager(readManager), m_lastReadRez(0)
{
    m_lastProcessedBytes = 0;
    m_bufferedReader = m_readManager.getReader("");
    m_readerID = m_bufferedReader->createReader(TS_FRAME_SIZE);
    m_curPos = m_bufEnd = nullptr;
    m_processedBytes = 0;
    m_isEOF = false;
    num_tracks = 0;
}